

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::VerifySamplerBinding<Diligent::SamplerVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,SamplerVkImpl *pSamplerImpl
               ,IDeviceObject *pCachedSampler,char *SignatureName)

{
  SAMPLER_FLAGS SVar1;
  bool bVar2;
  Char *pCVar3;
  SamplerDesc *pSVar4;
  undefined1 local_80 [8];
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  char *SignatureName_local;
  IDeviceObject *pCachedSampler_local;
  SamplerVkImpl *pSamplerImpl_local;
  BindResourceInfo *BindInfo_local;
  PipelineResourceDesc *ResDesc_local;
  
  msg.field_2._8_8_ = SignatureName;
  if ((BindInfo->BufferBaseOffset != 0) || (BindInfo->BufferRangeSize != 0)) {
    FormatString<char[46]>
              ((string *)local_50,(char (*) [46])"Buffer range can\'t be specified for samplers.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifySamplerBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1ff);
    std::__cxx11::string::~string((string *)local_50);
  }
  if (pSamplerImpl != (SamplerVkImpl *)0x0) {
    pSVar4 = DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ISamplerVk,_Diligent::RenderDeviceVkImpl,_Diligent::SamplerDesc>
                        *)pSamplerImpl);
    SVar1 = operator&(pSVar4->Flags,SAMPLER_FLAG_SUBSAMPLED);
    if (SVar1 != SAMPLER_FLAG_NONE) {
      FormatString<char[90]>
                ((string *)local_80,
                 (char (*) [90])
                 "Subsampled sampler must be added as an immutable sampler to the PSO or resource signature"
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"VerifySamplerBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x203);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  bVar2 = VerifyResourceBinding<Diligent::SamplerVkImpl>
                    ("sampler",ResDesc,BindInfo,pSamplerImpl,pCachedSampler,
                     (char *)msg.field_2._8_8_);
  return bVar2;
}

Assistant:

bool VerifySamplerBinding(const PipelineResourceDesc& ResDesc,
                          const BindResourceInfo&     BindInfo,
                          const SamplerImplType*      pSamplerImpl,
                          const IDeviceObject*        pCachedSampler,
                          const char*                 SignatureName)
{
    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range can't be specified for samplers.");
    }
    if (pSamplerImpl != nullptr && (pSamplerImpl->GetDesc().Flags & SAMPLER_FLAG_SUBSAMPLED) != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Subsampled sampler must be added as an immutable sampler to the PSO or resource signature");
    }
    return VerifyResourceBinding("sampler", ResDesc, BindInfo, pSamplerImpl, pCachedSampler, SignatureName);
}